

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O0

NMConnectivityState __thiscall
QNetworkManagerInterface::connectivityState(QNetworkManagerInterface *this)

{
  long lVar1;
  bool bVar2;
  QVariant *pQVar3;
  long in_FS_OFFSET;
  const_iterator it;
  QMap<QString,_QVariant> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_3934e::connectivityKey();
  QMap<QString,_QVariant>::constFind(in_stack_ffffffffffffffb8,(QString *)0x108b7c);
  QMap<QString,_QVariant>::cend(in_stack_ffffffffffffffb8);
  bVar2 = operator!=((const_iterator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                     ,(const_iterator *)in_stack_ffffffffffffffb8);
  if (bVar2) {
    pQVar3 = QMap<QString,_QVariant>::const_iterator::operator->((const_iterator *)0x108bb3);
    local_1c = QVariant::toUInt((bool *)pQVar3);
  }
  else {
    local_1c = NM_CONNECTIVITY_UNKNOWN;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkManagerInterface::NMConnectivityState QNetworkManagerInterface::connectivityState() const
{
    auto it = propertyMap.constFind(connectivityKey());
    if (it != propertyMap.cend())
        return static_cast<NMConnectivityState>(it->toUInt());
    return QNetworkManagerInterface::NM_CONNECTIVITY_UNKNOWN;
}